

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O2

void __thiscall
syntax_gtest_tests::iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test::Body
          (iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test *this)

{
  longdouble *in_R9;
  AssertionResult iutest_ar;
  longdouble local_208;
  AssertionResult local_1f0;
  iuCodeMessage local_1c8;
  Fixed local_198;
  
  local_208 = (longdouble)1;
  local_198.super_Message.m_stream.super_iu_stringstream._0_10_ = local_208;
  iutest::internal::backward::AlmostEqHelper<false>::CmpHelper::Compare<long_double,long_double>
            (&local_1f0,(CmpHelper *)0x30ca41,"x",(char *)&local_198,&local_208,in_R9);
  if (local_1f0.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0x121,local_1f0.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
  }
  else {
    std::__cxx11::string::~string((string *)&local_1f0);
    local_208 = (longdouble)1;
    local_198.super_Message.m_stream.super_iu_stringstream._0_10_ = local_208;
    iutest::internal::backward::AlmostEqHelper<false>::CmpHelper::Compare<long_double,long_double>
              (&local_1f0,(CmpHelper *)0x30ca41,"x",(char *)&local_198,&local_208,in_R9);
    if (local_1f0.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x123,local_1f0.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
    local_208 = (longdouble)1;
    local_198.super_Message.m_stream.super_iu_stringstream._0_10_ = local_208;
    iutest::internal::backward::AlmostEqHelper<false>::CmpHelper::Compare<long_double,long_double>
              (&local_1f0,(CmpHelper *)0x30ca41,"x",(char *)&local_198,&local_208,in_R9);
    if (local_1f0.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x125,local_1f0.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
    local_208 = (longdouble)1;
    local_198.super_Message.m_stream.super_iu_stringstream._0_10_ = local_208;
    iutest::internal::backward::AlmostEqHelper<false>::CmpHelper::Compare<long_double,long_double>
              (&local_1f0,(CmpHelper *)0x30ca41,"x",(char *)&local_198,&local_208,in_R9);
    if (local_1f0.m_result != false) goto LAB_002f8bf5;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0x127,local_1f0.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_002f8bf5:
  std::__cxx11::string::~string((string *)&local_1f0);
  return;
}

Assistant:

TEST(SyntaxTest, AlmostLongDoubleEq)
{
    if( long double x = 1.0l )
        ASSERT_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        EXPECT_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        INFORM_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        ASSUME_ALMOST_EQ(1.0l, x);
}